

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::FormEncodingString(uint Encoding)

{
  undefined1 auStack_18 [4];
  uint Encoding_local;
  
  if (Encoding == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addr");
  }
  else if (Encoding == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_block2");
  }
  else if (Encoding == 4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_block4");
  }
  else if (Encoding == 5) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_data2");
  }
  else if (Encoding == 6) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_data4");
  }
  else if (Encoding == 7) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_data8");
  }
  else if (Encoding == 8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_string");
  }
  else if (Encoding == 9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_block");
  }
  else if (Encoding == 10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_block1");
  }
  else if (Encoding == 0xb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_data1");
  }
  else if (Encoding == 0xc) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_flag");
  }
  else if (Encoding == 0xd) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_sdata");
  }
  else if (Encoding == 0xe) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strp");
  }
  else if (Encoding == 0xf) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_udata");
  }
  else if (Encoding == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref_addr");
  }
  else if (Encoding == 0x11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref1");
  }
  else if (Encoding == 0x12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref2");
  }
  else if (Encoding == 0x13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref4");
  }
  else if (Encoding == 0x14) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref8");
  }
  else if (Encoding == 0x15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref_udata");
  }
  else if (Encoding == 0x16) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_indirect");
  }
  else if (Encoding == 0x17) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_sec_offset");
  }
  else if (Encoding == 0x18) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_exprloc");
  }
  else if (Encoding == 0x19) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_flag_present");
  }
  else if (Encoding == 0x1a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strx");
  }
  else if (Encoding == 0x1b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addrx");
  }
  else if (Encoding == 0x1c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref_sup4");
  }
  else if (Encoding == 0x1d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strp_sup");
  }
  else if (Encoding == 0x1e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_data16");
  }
  else if (Encoding == 0x1f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_line_strp");
  }
  else if (Encoding == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref_sig8");
  }
  else if (Encoding == 0x21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_implicit_const");
  }
  else if (Encoding == 0x22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_loclistx");
  }
  else if (Encoding == 0x23) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_rnglistx");
  }
  else if (Encoding == 0x24) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_ref_sup8");
  }
  else if (Encoding == 0x25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strx1");
  }
  else if (Encoding == 0x26) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strx2");
  }
  else if (Encoding == 0x27) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strx3");
  }
  else if (Encoding == 0x28) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_strx4");
  }
  else if (Encoding == 0x29) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addrx1");
  }
  else if (Encoding == 0x2a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addrx2");
  }
  else if (Encoding == 0x2b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addrx3");
  }
  else if (Encoding == 0x2c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_addrx4");
  }
  else if (Encoding == 0x1f01) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_GNU_addr_index");
  }
  else if (Encoding == 0x1f02) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_GNU_str_index");
  }
  else if (Encoding == 0x1f20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_GNU_ref_alt");
  }
  else if (Encoding == 0x1f21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_FORM_GNU_strp_alt");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::FormEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return "DW_FORM_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}